

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.t.cpp
# Opt level: O1

void __thiscall dynamicgraph::Signal<double,_int>::Signal(Signal<double,_int> *this,string *name)

{
  pointer pcVar1;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + name->_M_string_length);
  (this->super_SignalBase<int>)._vptr_SignalBase = (_func_int **)&PTR__SignalBase_00122e48;
  (this->super_SignalBase<int>).name._M_dataplus._M_p =
       (pointer)&(this->super_SignalBase<int>).name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_SignalBase<int>).name,local_38,local_30 + (long)local_38);
  (this->super_SignalBase<int>).signalTime = 0;
  (this->super_SignalBase<int>).ready = false;
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  (this->super_SignalBase<int>)._vptr_SignalBase = (_func_int **)&PTR__Signal_00122d30;
  this->signalType = CONSTANT;
  this->Tcopy1 = 0.0;
  this->Tcopy2 = 0.0;
  this->Tcopy = &this->Tcopy1;
  this->providerMutex = (Mutex *)0x0;
  this->Treference = (double *)0x0;
  this->TreferenceNonConst = (double *)0x0;
  (this->Tfunction).super_function_base.vtable = (vtable_base *)0x0;
  *(undefined8 *)&(this->Tfunction).super_function_base.functor = 0;
  *(undefined8 *)((long)&(this->Tfunction).super_function_base.functor + 8) = 0;
  *(undefined8 *)((long)&(this->Tfunction).super_function_base.functor + 0x10) = 0;
  this->keepReference = false;
  return;
}

Assistant:

Signal<T, Time>::Signal(std::string name)
    : __SIGNAL_INIT(name, T(), NULL, NULL, NULL) {
  return;
}